

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.cpp
# Opt level: O0

void test_qclab_dense_SquareMatrix<float>(void)

{
  bool bVar1;
  char *pcVar2;
  float *pfVar3;
  char *in_R9;
  string local_1868;
  AssertHelper local_1848;
  Message local_1840;
  bool local_1831;
  undefined1 local_1830 [8];
  AssertionResult gtest_ar__36;
  SquareMatrix<float> I_check;
  SquareMatrix<float> I;
  AssertHelper local_17e0;
  Message local_17d8;
  bool local_17c9;
  undefined1 local_17c8 [8];
  AssertionResult gtest_ar__35;
  SquareMatrix<float> Z_check;
  SquareMatrix<float> Z;
  AssertHelper local_1778;
  Message local_1770;
  bool local_1761;
  undefined1 local_1760 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_1730;
  Message local_1728;
  bool local_1719;
  undefined1 local_1718 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_16e8;
  Message local_16e0;
  bool local_16d1;
  undefined1 local_16d0 [8];
  AssertionResult gtest_ar__32;
  SquareMatrix<float> prod;
  AssertHelper local_1690;
  Message local_1688;
  bool local_1679;
  undefined1 local_1678 [8];
  AssertionResult gtest_ar__31;
  Message local_1660;
  int local_1654;
  int64_t local_1650;
  undefined1 local_1648 [8];
  AssertionResult gtest_ar_58;
  SquareMatrix<float> local_1628;
  SquareMatrix<float> local_1618;
  undefined1 local_1608 [8];
  SquareMatrix<float> prodABCD;
  AssertHelper local_15d8;
  Message local_15d0;
  bool local_15c1;
  undefined1 local_15c0 [8];
  AssertionResult gtest_ar__30;
  Message local_15a8;
  int local_159c;
  int64_t local_1598;
  undefined1 local_1590 [8];
  AssertionResult gtest_ar_57;
  SquareMatrix<float> local_1570;
  undefined1 local_1560 [8];
  SquareMatrix<float> prodABC;
  AssertHelper local_1530;
  Message local_1528;
  bool local_1519;
  undefined1 local_1518 [8];
  AssertionResult gtest_ar__29;
  Message local_1500;
  int local_14f4;
  int64_t local_14f0;
  undefined1 local_14e8 [8];
  AssertionResult gtest_ar_56;
  undefined1 local_14c8 [8];
  SquareMatrix<float> prodAB;
  SquareMatrix<float> prodABCD_check;
  SquareMatrix<float> prodABC_check;
  SquareMatrix<float> prodAB_check;
  AssertHelper local_1468;
  Message local_1460;
  bool local_1451;
  undefined1 local_1450 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_1420;
  Message local_1418;
  bool local_1409;
  undefined1 local_1408 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_13d8;
  Message local_13d0;
  bool local_13c1;
  undefined1 local_13c0 [8];
  AssertionResult gtest_ar__26;
  SquareMatrix<float> minus;
  AssertHelper local_1380;
  Message local_1378;
  bool local_1369;
  undefined1 local_1368 [8];
  AssertionResult gtest_ar__25;
  Message local_1350;
  int local_1344;
  int64_t local_1340;
  undefined1 local_1338 [8];
  AssertionResult gtest_ar_55;
  SquareMatrix<float> local_1318;
  SquareMatrix<float> local_1308;
  undefined1 local_12f8 [8];
  SquareMatrix<float> minusABCD;
  AssertHelper local_12c8;
  Message local_12c0;
  bool local_12b1;
  undefined1 local_12b0 [8];
  AssertionResult gtest_ar__24;
  Message local_1298;
  int local_128c;
  int64_t local_1288;
  undefined1 local_1280 [8];
  AssertionResult gtest_ar_54;
  SquareMatrix<float> local_1260;
  undefined1 local_1250 [8];
  SquareMatrix<float> minusABC;
  AssertHelper local_1220;
  Message local_1218;
  bool local_1209;
  undefined1 local_1208 [8];
  AssertionResult gtest_ar__23;
  Message local_11f0;
  int local_11e4;
  int64_t local_11e0;
  undefined1 local_11d8 [8];
  AssertionResult gtest_ar_53;
  undefined1 local_11b8 [8];
  SquareMatrix<float> minusAB;
  SquareMatrix<float> minusABCD_check;
  SquareMatrix<float> minusABC_check;
  SquareMatrix<float> minusAB_check;
  AssertHelper local_1158;
  Message local_1150;
  bool local_1141;
  undefined1 local_1140 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_1110;
  Message local_1108;
  bool local_10f9;
  undefined1 local_10f8 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_10c8;
  Message local_10c0;
  bool local_10b1;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar__20;
  SquareMatrix<float> sum;
  AssertHelper local_1070;
  Message local_1068;
  bool local_1059;
  undefined1 local_1058 [8];
  AssertionResult gtest_ar__19;
  Message local_1040;
  int local_1034;
  int64_t local_1030;
  undefined1 local_1028 [8];
  AssertionResult gtest_ar_52;
  SquareMatrix<float> local_1008;
  SquareMatrix<float> local_ff8;
  undefined1 local_fe8 [8];
  SquareMatrix<float> sumABCD;
  AssertHelper local_fb8;
  Message local_fb0;
  bool local_fa1;
  undefined1 local_fa0 [8];
  AssertionResult gtest_ar__18;
  Message local_f88;
  int local_f7c;
  int64_t local_f78;
  undefined1 local_f70 [8];
  AssertionResult gtest_ar_51;
  SquareMatrix<float> local_f50;
  undefined1 local_f40 [8];
  SquareMatrix<float> sumABC;
  AssertHelper local_f10;
  Message local_f08;
  bool local_ef9;
  undefined1 local_ef8 [8];
  AssertionResult gtest_ar__17;
  Message local_ee0;
  int local_ed4;
  int64_t local_ed0;
  undefined1 local_ec8 [8];
  AssertionResult gtest_ar_50;
  undefined1 local_ea8 [8];
  SquareMatrix<float> sumAB;
  SquareMatrix<float> sumABCD_check;
  SquareMatrix<float> sumABC_check;
  SquareMatrix<float> sumAB_check;
  SquareMatrix<float> D;
  SquareMatrix<float> C;
  SquareMatrix<float> B;
  SquareMatrix<float> A;
  AssertHelper local_e08;
  Message local_e00;
  bool local_df1;
  undefined1 local_df0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_dc0;
  Message local_db8;
  bool local_da9;
  undefined1 local_da8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_d78;
  Message local_d70;
  bool local_d61;
  undefined1 local_d60 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_d30;
  Message local_d28;
  bool local_d19;
  undefined1 local_d18 [8];
  AssertionResult gtest_ar__13;
  SquareMatrix<float> M5;
  AssertHelper local_cd8;
  Message local_cd0;
  bool local_cc1;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_c90;
  Message local_c88;
  bool local_c79;
  undefined1 local_c78 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_c48;
  Message local_c40;
  bool local_c31;
  undefined1 local_c30 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_c00;
  Message local_bf8;
  bool local_be9;
  undefined1 local_be8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_bb8;
  Message local_bb0;
  bool local_ba1;
  undefined1 local_ba0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_b70;
  Message local_b68;
  bool local_b59;
  undefined1 local_b58 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_b28;
  Message local_b20;
  bool local_b11;
  undefined1 local_b10 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_ae0;
  Message local_ad8;
  bool local_ac9;
  undefined1 local_ac8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_a98;
  Message local_a90;
  bool local_a81;
  undefined1 local_a80 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_a50;
  Message local_a48;
  bool local_a39;
  undefined1 local_a38 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_a08;
  Message local_a00;
  bool local_9f1;
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar__2;
  Message local_9d8;
  int local_9cc;
  int64_t local_9c8;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar_49;
  Message local_9a8;
  int local_99c;
  int64_t local_998;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_48;
  Message local_978;
  int local_96c;
  int64_t local_968;
  undefined1 local_960 [8];
  AssertionResult gtest_ar_47;
  Message local_948;
  int local_93c;
  int64_t local_938;
  undefined1 local_930 [8];
  AssertionResult gtest_ar_46;
  SquareMatrix<float> M2copy;
  AssertHelper local_8f0;
  Message local_8e8;
  bool local_8d9;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar__1;
  Message local_8c0;
  int local_8b4;
  int64_t local_8b0;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar_45;
  Message local_890;
  int local_884;
  int64_t local_880;
  undefined1 local_878 [8];
  AssertionResult gtest_ar_44;
  Message local_860;
  int local_854;
  int64_t local_850;
  undefined1 local_848 [8];
  AssertionResult gtest_ar_43;
  Message local_830;
  int local_824;
  int64_t local_820;
  undefined1 local_818 [8];
  AssertionResult gtest_ar_42;
  SquareMatrix<float> M1copy;
  AssertHelper local_7d8;
  Message local_7d0;
  bool local_7c1;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_;
  Message local_7a8;
  int local_79c;
  int64_t local_798;
  undefined1 local_790 [8];
  AssertionResult gtest_ar_41;
  Message local_778;
  int local_76c;
  int64_t local_768;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_40;
  Message local_748;
  int local_73c;
  int64_t local_738;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_39;
  Message local_718;
  int local_70c;
  int64_t local_708;
  undefined1 local_700 [8];
  AssertionResult gtest_ar_38;
  SquareMatrix<float> M4copy;
  Message local_6d8;
  float local_6cc;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_37;
  Message local_6b0;
  float local_6a4;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar_36;
  Message local_688;
  float local_67c;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_35;
  Message local_660;
  float local_654;
  undefined1 local_650 [8];
  AssertionResult gtest_ar_34;
  Message local_638;
  float local_62c;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_33;
  Message local_610;
  float local_604;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_32;
  Message local_5e8;
  float local_5dc;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_31;
  Message local_5c0;
  float local_5b4;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_30;
  Message local_598;
  float local_58c;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_29;
  Message local_570;
  float local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_28;
  Message local_548;
  float local_53c;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_27;
  Message local_520;
  float local_514;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_26;
  Message local_4f8;
  float local_4ec;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_25;
  Message local_4d0;
  float local_4c4;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_24;
  Message local_4a8;
  float local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_23;
  Message local_480;
  float local_474;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_22;
  Message local_458;
  int local_44c;
  int64_t local_448;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_21;
  Message local_428;
  int local_41c;
  int64_t local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_20;
  Message local_3f8;
  int local_3ec;
  int64_t local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_19;
  Message local_3c8;
  int local_3bc;
  int64_t local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_18;
  SquareMatrix<float> M4;
  Message local_388;
  float local_37c;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_17;
  Message local_360;
  float local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_16;
  Message local_338;
  float local_32c;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_15;
  Message local_310;
  float local_304;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_14;
  Message local_2e8;
  int local_2dc;
  int64_t local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_13;
  Message local_2b8;
  int local_2ac;
  int64_t local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_12;
  Message local_288;
  int local_27c;
  int64_t local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_11;
  Message local_258;
  int local_24c;
  int64_t local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_10;
  SquareMatrix<float> M3;
  Message local_218;
  float local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_9;
  int j_2;
  int i_2;
  Message local_1e8;
  int local_1dc;
  int64_t local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_8;
  Message local_1b8;
  int local_1ac;
  int64_t local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_7;
  Message local_188;
  int local_17c;
  int64_t local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_6;
  Message local_158;
  int local_14c;
  int64_t local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_5;
  SquareMatrix<float> M2;
  Message local_118;
  float local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_4;
  int local_f0;
  int j_1;
  int i_1;
  int j;
  int i;
  int c;
  Message local_d8;
  int local_cc;
  int64_t local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  Message local_a8;
  int local_9c;
  int64_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  int local_6c;
  int64_t local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48;
  int local_40 [4];
  int64_t local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  SquareMatrix<float> M1;
  
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)&gtest_ar.message_,3);
  local_30 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)&gtest_ar.message_);
  local_40[0] = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_28,"M1.size()","3",&local_30,local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_68 = qclab::dense::SquareMatrix<float>::rows((SquareMatrix<float> *)&gtest_ar.message_);
  local_6c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_60,"M1.rows()","3",&local_68,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_98 = qclab::dense::SquareMatrix<float>::cols((SquareMatrix<float> *)&gtest_ar.message_);
  local_9c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_90,"M1.cols()","3",&local_98,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c8 = qclab::dense::SquareMatrix<float>::ld((SquareMatrix<float> *)&gtest_ar.message_);
  local_cc = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_c0,"M1.ld()","3",&local_c8,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  j = 0;
  for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < 3; j_1 = j_1 + 1) {
      pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                         ((SquareMatrix<float> *)&gtest_ar.message_,(long)i_1,(long)j_1);
      *pfVar3 = (float)j + 0.5;
      j = j + 1;
    }
  }
  j = 0;
  for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
    for (gtest_ar_4.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._4_4_ = 0;
        gtest_ar_4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ < 3;
        gtest_ar_4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ =
             gtest_ar_4.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_ + 1) {
      pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                         ((SquareMatrix<float> *)&gtest_ar.message_,(long)local_f0,
                          (long)gtest_ar_4.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_);
      local_10c = (float)j + 0.5;
      testing::internal::EqHelper::Compare<float,_float,_nullptr>
                ((EqHelper *)local_108,"M1(i,j)","T(c + 0.5)",pfVar3,&local_10c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
      if (!bVar1) {
        testing::Message::Message(&local_118);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&M2.data_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
                   ,0x18,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&M2.data_,&local_118);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M2.data_);
        testing::Message::~Message(&local_118);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
      j = j + 1;
    }
  }
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_5.message_,3,3.14);
  local_148 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)&gtest_ar_5.message_);
  local_14c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_140,"M2.size()","3",&local_148,&local_14c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_178 = qclab::dense::SquareMatrix<float>::rows((SquareMatrix<float> *)&gtest_ar_5.message_);
  local_17c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_170,"M2.rows()","3",&local_178,&local_17c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1a8 = qclab::dense::SquareMatrix<float>::cols((SquareMatrix<float> *)&gtest_ar_5.message_);
  local_1ac = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1a0,"M2.cols()","3",&local_1a8,&local_1ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1d8 = qclab::dense::SquareMatrix<float>::ld((SquareMatrix<float> *)&gtest_ar_5.message_);
  local_1dc = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1d0,"M2.ld()","3",&local_1d8,&local_1dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&j_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&j_2,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j_2);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  for (gtest_ar_9.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      gtest_ar_9.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ < 3;
      gtest_ar_9.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar_9.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    for (gtest_ar_9.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._0_4_ = 0;
        (int)gtest_ar_9.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl < 3;
        gtest_ar_9.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             (int)gtest_ar_9.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 1) {
      pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                         ((SquareMatrix<float> *)&gtest_ar_5.message_,
                          (long)gtest_ar_9.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_,
                          (long)(int)gtest_ar_9.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl);
      local_20c = 3.14;
      testing::internal::EqHelper::Compare<float,_float,_nullptr>
                ((EqHelper *)local_208,"M2(i,j)","T(3.14)",pfVar3,&local_20c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
      if (!bVar1) {
        testing::Message::Message(&local_218);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&M3.data_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
                   ,0x25,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&M3.data_,&local_218);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M3.data_);
        testing::Message::~Message(&local_218);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
    }
  }
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_10.message_,1.0,2.0,3.0,4.0);
  local_248 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)&gtest_ar_10.message_);
  local_24c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_240,"M3.size()","2",&local_248,&local_24c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  local_278 = qclab::dense::SquareMatrix<float>::rows((SquareMatrix<float> *)&gtest_ar_10.message_);
  local_27c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_270,"M3.rows()","2",&local_278,&local_27c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_2a8 = qclab::dense::SquareMatrix<float>::cols((SquareMatrix<float> *)&gtest_ar_10.message_);
  local_2ac = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2a0,"M3.cols()","2",&local_2a8,&local_2ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_2d8 = qclab::dense::SquareMatrix<float>::ld((SquareMatrix<float> *)&gtest_ar_10.message_);
  local_2dc = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2d0,"M3.ld()","2",&local_2d8,&local_2dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_10.message_,0,0);
  local_304 = 1.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_300,"M3(0,0)","T(1.0)",pfVar3,&local_304);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_10.message_,1,0);
  local_32c = 3.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_328,"M3(1,0)","T(3.0)",pfVar3,&local_32c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_10.message_,0,1);
  local_354 = 2.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_350,"M3(0,1)","T(2.0)",pfVar3,&local_354);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_10.message_,1,1);
  local_37c = 4.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_378,"M3(1,1)","T(4.0)",pfVar3,&local_37c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4.data_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4.data_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_18.message_,1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0,10.0,
             11.0,12.0,13.0,14.0,15.0,16.0);
  local_3b8 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)&gtest_ar_18.message_);
  local_3bc = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_3b0,"M4.size()","4",&local_3b8,&local_3bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  local_3e8 = qclab::dense::SquareMatrix<float>::rows((SquareMatrix<float> *)&gtest_ar_18.message_);
  local_3ec = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_3e0,"M4.rows()","4",&local_3e8,&local_3ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  local_418 = qclab::dense::SquareMatrix<float>::cols((SquareMatrix<float> *)&gtest_ar_18.message_);
  local_41c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_410,"M4.cols()","4",&local_418,&local_41c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  local_448 = qclab::dense::SquareMatrix<float>::ld((SquareMatrix<float> *)&gtest_ar_18.message_);
  local_44c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_440,"M4.ld()","4",&local_448,&local_44c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,0,0);
  local_474 = 1.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_470,"M4(0,0)","T( 1.0)",pfVar3,&local_474);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,1,0);
  local_49c = 5.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_498,"M4(1,0)","T( 5.0)",pfVar3,&local_49c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,2,0);
  local_4c4 = 9.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_4c0,"M4(2,0)","T( 9.0)",pfVar3,&local_4c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,3,0);
  local_4ec = 13.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_4e8,"M4(3,0)","T(13.0)",pfVar3,&local_4ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,0,1);
  local_514 = 2.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_510,"M4(0,1)","T( 2.0)",pfVar3,&local_514);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_520);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,1,1);
  local_53c = 6.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_538,"M4(1,1)","T( 6.0)",pfVar3,&local_53c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(&local_548);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,2,1);
  local_564 = 10.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_560,"M4(2,1)","T(10.0)",pfVar3,&local_564);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar1) {
    testing::Message::Message(&local_570);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,3,1);
  local_58c = 14.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_588,"M4(3,1)","T(14.0)",pfVar3,&local_58c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,0,2);
  local_5b4 = 3.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_5b0,"M4(0,2)","T( 3.0)",pfVar3,&local_5b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,1,2);
  local_5dc = 7.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_5d8,"M4(1,2)","T( 7.0)",pfVar3,&local_5dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar1) {
    testing::Message::Message(&local_5e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,2,2);
  local_604 = 11.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_600,"M4(2,2)","T(11.0)",pfVar3,&local_604);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    testing::Message::Message(&local_610);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_610);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,3,2);
  local_62c = 15.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_628,"M4(3,2)","T(15.0)",pfVar3,&local_62c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_628);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_638);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,0,3);
  local_654 = 4.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_650,"M4(0,3)","T( 4.0)",pfVar3,&local_654);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_650);
  if (!bVar1) {
    testing::Message::Message(&local_660);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_650);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,1,3);
  local_67c = 8.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_678,"M4(1,3)","T( 8.0)",pfVar3,&local_67c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_688);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,2,3);
  local_6a4 = 12.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_6a0,"M4(2,3)","T(12.0)",pfVar3,&local_6a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar1) {
    testing::Message::Message(&local_6b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar_18.message_,3,3);
  local_6cc = 16.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_6c8,"M4(3,3)","T(16.0)",pfVar3,&local_6cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c8);
  if (!bVar1) {
    testing::Message::Message(&local_6d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy.data_,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy.data_);
    testing::Message::~Message(&local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c8);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_38.message_,
             (SquareMatrix<float> *)&gtest_ar_18.message_);
  local_708 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)&gtest_ar_38.message_);
  local_70c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_700,"M4copy.size()","4",&local_708,&local_70c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  local_738 = qclab::dense::SquareMatrix<float>::rows((SquareMatrix<float> *)&gtest_ar_38.message_);
  local_73c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_730,"M4copy.rows()","4",&local_738,&local_73c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(&local_748);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  local_768 = qclab::dense::SquareMatrix<float>::cols((SquareMatrix<float> *)&gtest_ar_38.message_);
  local_76c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_760,"M4copy.cols()","4",&local_768,&local_76c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar1) {
    testing::Message::Message(&local_778);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_760);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  local_798 = qclab::dense::SquareMatrix<float>::ld((SquareMatrix<float> *)&gtest_ar_38.message_);
  local_79c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_790,"M4copy.ld()","4",&local_798,&local_79c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_790);
  if (!bVar1) {
    testing::Message::Message(&local_7a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_790);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_790);
  local_7c1 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar_38.message_,
                         (SquareMatrix<float> *)&gtest_ar_18.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c0,&local_7c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&M1copy.data_,(internal *)local_7c0,(AssertionResult *)"M4copy == M4",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    std::__cxx11::string::~string((string *)&M1copy.data_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)&gtest_ar_42.message_);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar_42.message_,(SquareMatrix<float> *)&gtest_ar.message_)
  ;
  local_820 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)&gtest_ar_42.message_);
  local_824 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_818,"M1copy.size()","3",&local_820,&local_824);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    testing::Message::Message(&local_830);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_830);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  local_850 = qclab::dense::SquareMatrix<float>::rows((SquareMatrix<float> *)&gtest_ar_42.message_);
  local_854 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_848,"M1copy.rows()","3",&local_850,&local_854);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
  if (!bVar1) {
    testing::Message::Message(&local_860);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_848);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_860);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
  local_880 = qclab::dense::SquareMatrix<float>::cols((SquareMatrix<float> *)&gtest_ar_42.message_);
  local_884 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_878,"M1copy.cols()","3",&local_880,&local_884);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_878);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_890);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
  local_8b0 = qclab::dense::SquareMatrix<float>::ld((SquareMatrix<float> *)&gtest_ar_42.message_);
  local_8b4 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_8a8,"M1copy.ld()","3",&local_8b0,&local_8b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a8);
  if (!bVar1) {
    testing::Message::Message(&local_8c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_8c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
  local_8d9 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar_42.message_,
                         (SquareMatrix<float> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8d8,&local_8d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
  if (!bVar1) {
    testing::Message::Message(&local_8e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&M2copy.data_,(internal *)local_8d8,(AssertionResult *)"M1copy == M1",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8f0,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper(&local_8f0);
    std::__cxx11::string::~string((string *)&M2copy.data_);
    testing::Message::~Message(&local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)&gtest_ar_46.message_,3);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar_46.message_,
             (SquareMatrix<float> *)&gtest_ar_5.message_);
  local_938 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)&gtest_ar_46.message_);
  local_93c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_930,"M2copy.size()","3",&local_938,&local_93c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar1) {
    testing::Message::Message(&local_948);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_930);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  local_968 = qclab::dense::SquareMatrix<float>::rows((SquareMatrix<float> *)&gtest_ar_46.message_);
  local_96c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_960,"M2copy.rows()","3",&local_968,&local_96c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_960);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_960);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_960);
  local_998 = qclab::dense::SquareMatrix<float>::cols((SquareMatrix<float> *)&gtest_ar_46.message_);
  local_99c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_990,"M2copy.cols()","3",&local_998,&local_99c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  local_9c8 = qclab::dense::SquareMatrix<float>::ld((SquareMatrix<float> *)&gtest_ar_46.message_);
  local_9cc = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_9c0,"M2copy.ld()","3",&local_9c8,&local_9cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_9d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  local_9f1 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar_46.message_,
                         (SquareMatrix<float> *)&gtest_ar_5.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9f0,&local_9f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
  if (!bVar1) {
    testing::Message::Message(&local_a00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_9f0,
               (AssertionResult *)"M2copy == M2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a08,&local_a00);
    testing::internal::AssertHelper::~AssertHelper(&local_a08);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
  local_a39 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar_5.message_,
                         (SquareMatrix<float> *)&gtest_ar_5.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a38,&local_a39,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
  if (!bVar1) {
    testing::Message::Message(&local_a48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_a38,(AssertionResult *)"M2 == M2",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a50,&local_a48);
    testing::internal::AssertHelper::~AssertHelper(&local_a50);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
  bVar1 = qclab::dense::SquareMatrix<float>::operator!=
                    ((SquareMatrix<float> *)&gtest_ar_5.message_,
                     (SquareMatrix<float> *)&gtest_ar_5.message_);
  local_a81 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a80,&local_a81,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a80);
  if (!bVar1) {
    testing::Message::Message(&local_a90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_a80,(AssertionResult *)"M2 != M2",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a98,&local_a90);
    testing::internal::AssertHelper::~AssertHelper(&local_a98);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_a90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a80);
  local_ac9 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar_10.message_,
                         (SquareMatrix<float> *)&gtest_ar_10.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ac8,&local_ac9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac8);
  if (!bVar1) {
    testing::Message::Message(&local_ad8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_ac8,(AssertionResult *)"M3 == M3",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ae0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ae0,&local_ad8);
    testing::internal::AssertHelper::~AssertHelper(&local_ae0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_ad8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac8);
  bVar1 = qclab::dense::SquareMatrix<float>::operator!=
                    ((SquareMatrix<float> *)&gtest_ar_10.message_,
                     (SquareMatrix<float> *)&gtest_ar_10.message_);
  local_b11 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b10,&local_b11,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b10);
  if (!bVar1) {
    testing::Message::Message(&local_b20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_b10,(AssertionResult *)"M3 != M3",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b28,&local_b20);
    testing::internal::AssertHelper::~AssertHelper(&local_b28);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_b20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b10);
  local_b59 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar_18.message_,
                         (SquareMatrix<float> *)&gtest_ar_18.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b58,&local_b59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
  if (!bVar1) {
    testing::Message::Message(&local_b68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_b58,(AssertionResult *)"M4 == M4",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b70,&local_b68);
    testing::internal::AssertHelper::~AssertHelper(&local_b70);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_b68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
  bVar1 = qclab::dense::SquareMatrix<float>::operator!=
                    ((SquareMatrix<float> *)&gtest_ar_18.message_,
                     (SquareMatrix<float> *)&gtest_ar_18.message_);
  local_ba1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ba0,&local_ba1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba0);
  if (!bVar1) {
    testing::Message::Message(&local_bb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_ba0,(AssertionResult *)"M4 != M4",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bb8,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper(&local_bb8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba0);
  local_be9 = qclab::dense::SquareMatrix<float>::operator!=
                        ((SquareMatrix<float> *)&gtest_ar_5.message_,
                         (SquareMatrix<float> *)&gtest_ar_10.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_be8,&local_be9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be8);
  if (!bVar1) {
    testing::Message::Message(&local_bf8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_be8,(AssertionResult *)"M2 != M3",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c00,&local_bf8);
    testing::internal::AssertHelper::~AssertHelper(&local_c00);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_bf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be8);
  bVar1 = qclab::dense::SquareMatrix<float>::operator==
                    ((SquareMatrix<float> *)&gtest_ar_5.message_,
                     (SquareMatrix<float> *)&gtest_ar_10.message_);
  local_c31 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c30,&local_c31,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c30);
  if (!bVar1) {
    testing::Message::Message(&local_c40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_c30,(AssertionResult *)"M2 == M3",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c48,&local_c40);
    testing::internal::AssertHelper::~AssertHelper(&local_c48);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_c40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c30);
  local_c79 = qclab::dense::SquareMatrix<float>::operator!=
                        ((SquareMatrix<float> *)&gtest_ar_10.message_,
                         (SquareMatrix<float> *)&gtest_ar_18.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c78,&local_c79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c78);
  if (!bVar1) {
    testing::Message::Message(&local_c88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_c78,(AssertionResult *)"M3 != M4",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c90,&local_c88);
    testing::internal::AssertHelper::~AssertHelper(&local_c90);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_c88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c78);
  bVar1 = qclab::dense::SquareMatrix<float>::operator==
                    ((SquareMatrix<float> *)&gtest_ar_10.message_,
                     (SquareMatrix<float> *)&gtest_ar_18.message_);
  local_cc1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cc0,&local_cc1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc0);
  if (!bVar1) {
    testing::Message::Message(&local_cd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&M5.data_,(internal *)local_cc0,(AssertionResult *)"M3 == M4","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cd8,&local_cd0);
    testing::internal::AssertHelper::~AssertHelper(&local_cd8);
    std::__cxx11::string::~string((string *)&M5.data_);
    testing::Message::~Message(&local_cd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__13.message_,1.0,2.0,3.0,4.0,5.0,6.0,0.0,8.0,9.0,10.0,
             11.0,12.0,13.0,14.0,15.0,16.0);
  local_d19 = qclab::dense::SquareMatrix<float>::operator!=
                        ((SquareMatrix<float> *)&gtest_ar_18.message_,
                         (SquareMatrix<float> *)&gtest_ar__13.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d18,&local_d19,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d18);
  if (!bVar1) {
    testing::Message::Message(&local_d28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_d18,(AssertionResult *)"M4 != M5",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d30,&local_d28);
    testing::internal::AssertHelper::~AssertHelper(&local_d30);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_d28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d18);
  bVar1 = qclab::dense::SquareMatrix<float>::operator==
                    ((SquareMatrix<float> *)&gtest_ar_18.message_,
                     (SquareMatrix<float> *)&gtest_ar__13.message_);
  local_d61 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d60,&local_d61,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d60);
  if (!bVar1) {
    testing::Message::Message(&local_d70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_d60,(AssertionResult *)"M4 == M5",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d78,&local_d70);
    testing::internal::AssertHelper::~AssertHelper(&local_d78);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_d70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d60);
  pfVar3 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)&gtest_ar__13.message_,1,2);
  *pfVar3 = 7.0;
  local_da9 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar_18.message_,
                         (SquareMatrix<float> *)&gtest_ar__13.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_da8,&local_da9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da8);
  if (!bVar1) {
    testing::Message::Message(&local_db8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_da8,(AssertionResult *)"M4 == M5",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_dc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=(&local_dc0,&local_db8);
    testing::internal::AssertHelper::~AssertHelper(&local_dc0);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_db8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_da8);
  bVar1 = qclab::dense::SquareMatrix<float>::operator!=
                    ((SquareMatrix<float> *)&gtest_ar_18.message_,
                     (SquareMatrix<float> *)&gtest_ar__13.message_);
  local_df1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_df0,&local_df1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_df0);
  if (!bVar1) {
    testing::Message::Message(&local_e00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&A.data_,(internal *)local_df0,(AssertionResult *)"M4 != M5","true","false"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e08,&local_e00);
    testing::internal::AssertHelper::~AssertHelper(&local_e08);
    std::__cxx11::string::~string((string *)&A.data_);
    testing::Message::~Message(&local_e00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_df0);
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)&B.data_,1.0,2.0,3.0,4.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)&C.data_,5.0,7.0,6.0,8.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&D.data_,9.0,11.0,10.0,12.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&sumAB_check.data_,13.0,14.0,15.0,16.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&sumABC_check.data_,6.0,9.0,9.0,12.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&sumABCD_check.data_,15.0,20.0,19.0,24.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&sumAB.data_,28.0,34.0,34.0,40.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_50.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::operator+
            ((dense *)local_ea8,(SquareMatrix<float> *)&gtest_ar_50.message_,
             (SquareMatrix<float> *)&C.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_50.message_);
  local_ed0 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)local_ea8);
  local_ed4 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_ec8,"sumAB.size()","2",&local_ed0,&local_ed4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec8);
  if (!bVar1) {
    testing::Message::Message(&local_ee0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ec8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_ee0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_ee0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec8);
  local_ef9 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)local_ea8,(SquareMatrix<float> *)&sumABC_check.data_
                        );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ef8,&local_ef9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef8);
  if (!bVar1) {
    testing::Message::Message(&local_f08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sumABC.data_,(internal *)local_ef8,
               (AssertionResult *)"sumAB == sumAB_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f10,&local_f08);
    testing::internal::AssertHelper::~AssertHelper(&local_f10);
    std::__cxx11::string::~string((string *)&sumABC.data_);
    testing::Message::~Message(&local_f08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef8);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_51.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::operator+
            ((dense *)&local_f50,(SquareMatrix<float> *)&gtest_ar_51.message_,
             (SquareMatrix<float> *)&C.data_);
  qclab::dense::operator+((dense *)local_f40,&local_f50,(SquareMatrix<float> *)&D.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_f50);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_51.message_);
  local_f78 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)local_f40);
  local_f7c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_f70,"sumABC.size()","2",&local_f78,&local_f7c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f70);
  if (!bVar1) {
    testing::Message::Message(&local_f88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__18.message_,&local_f88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_f88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f70);
  local_fa1 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)local_f40,
                         (SquareMatrix<float> *)&sumABCD_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fa0,&local_fa1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
  if (!bVar1) {
    testing::Message::Message(&local_fb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sumABCD.data_,(internal *)local_fa0,
               (AssertionResult *)"sumABC == sumABC_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=(&local_fb8,&local_fb0);
    testing::internal::AssertHelper::~AssertHelper(&local_fb8);
    std::__cxx11::string::~string((string *)&sumABCD.data_);
    testing::Message::~Message(&local_fb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_52.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::operator+
            ((dense *)&local_1008,(SquareMatrix<float> *)&gtest_ar_52.message_,
             (SquareMatrix<float> *)&C.data_);
  qclab::dense::operator+((dense *)&local_ff8,&local_1008,(SquareMatrix<float> *)&D.data_);
  qclab::dense::operator+((dense *)local_fe8,&local_ff8,(SquareMatrix<float> *)&sumAB_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_ff8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1008);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_52.message_);
  local_1030 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)local_fe8);
  local_1034 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1028,"sumABCD.size()","2",&local_1030,&local_1034);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1028);
  if (!bVar1) {
    testing::Message::Message(&local_1040);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1028);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__19.message_,&local_1040);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_1040);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1028);
  local_1059 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)local_fe8,(SquareMatrix<float> *)&sumAB.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1058,&local_1059,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1058);
  if (!bVar1) {
    testing::Message::Message(&local_1068);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sum.data_,(internal *)local_1058,
               (AssertionResult *)"sumABCD == sumABCD_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1070,&local_1068);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    std::__cxx11::string::~string((string *)&sum.data_);
    testing::Message::~Message(&local_1068);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1058);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__20.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::SquareMatrix<float>::operator+=
            ((SquareMatrix<float> *)&gtest_ar__20.message_,(SquareMatrix<float> *)&C.data_);
  local_10b1 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__20.message_,
                          (SquareMatrix<float> *)&sumABC_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10b0,&local_10b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b0);
  if (!bVar1) {
    testing::Message::Message(&local_10c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_10b0,
               (AssertionResult *)"sum == sumAB_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_10c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=(&local_10c8,&local_10c0);
    testing::internal::AssertHelper::~AssertHelper(&local_10c8);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_10c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b0);
  qclab::dense::SquareMatrix<float>::operator+=
            ((SquareMatrix<float> *)&gtest_ar__20.message_,(SquareMatrix<float> *)&D.data_);
  local_10f9 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__20.message_,
                          (SquareMatrix<float> *)&sumABCD_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10f8,&local_10f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10f8);
  if (!bVar1) {
    testing::Message::Message(&local_1108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_10f8,
               (AssertionResult *)"sum == sumABC_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1110,&local_1108);
    testing::internal::AssertHelper::~AssertHelper(&local_1110);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_1108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10f8);
  qclab::dense::SquareMatrix<float>::operator+=
            ((SquareMatrix<float> *)&gtest_ar__20.message_,(SquareMatrix<float> *)&sumAB_check.data_
            );
  local_1141 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__20.message_,
                          (SquareMatrix<float> *)&sumAB.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1140,&local_1141,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1140);
  if (!bVar1) {
    testing::Message::Message(&local_1150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minusAB_check.data_,(internal *)local_1140,
               (AssertionResult *)"sum == sumABCD_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1158,&local_1150);
    testing::internal::AssertHelper::~AssertHelper(&local_1158);
    std::__cxx11::string::~string((string *)&minusAB_check.data_);
    testing::Message::~Message(&local_1150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1140);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&minusABC_check.data_,-4.0,-5.0,-3.0,-4.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&minusABCD_check.data_,-13.0,-16.0,-13.0,-16.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&minusAB.data_,-26.0,-30.0,-28.0,-32.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_53.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::operator-
            ((dense *)local_11b8,(SquareMatrix<float> *)&gtest_ar_53.message_,
             (SquareMatrix<float> *)&C.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_53.message_);
  local_11e0 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)local_11b8);
  local_11e4 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_11d8,"minusAB.size()","2",&local_11e0,&local_11e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11d8);
  if (!bVar1) {
    testing::Message::Message(&local_11f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__23.message_,&local_11f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_11f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11d8);
  local_1209 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)local_11b8,
                          (SquareMatrix<float> *)&minusABC_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1208,&local_1209,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1208);
  if (!bVar1) {
    testing::Message::Message(&local_1218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minusABC.data_,(internal *)local_1208,
               (AssertionResult *)"minusAB == minusAB_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1220,&local_1218);
    testing::internal::AssertHelper::~AssertHelper(&local_1220);
    std::__cxx11::string::~string((string *)&minusABC.data_);
    testing::Message::~Message(&local_1218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1208);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_54.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::operator-
            ((dense *)&local_1260,(SquareMatrix<float> *)&gtest_ar_54.message_,
             (SquareMatrix<float> *)&C.data_);
  qclab::dense::operator-((dense *)local_1250,&local_1260,(SquareMatrix<float> *)&D.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1260);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_54.message_);
  local_1288 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)local_1250);
  local_128c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1280,"minusABC.size()","2",&local_1288,&local_128c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1280);
  if (!bVar1) {
    testing::Message::Message(&local_1298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__24.message_,&local_1298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_1298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1280);
  local_12b1 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)local_1250,
                          (SquareMatrix<float> *)&minusABCD_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_12b0,&local_12b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12b0);
  if (!bVar1) {
    testing::Message::Message(&local_12c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minusABCD.data_,(internal *)local_12b0,
               (AssertionResult *)"minusABC == minusABC_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_12c8,&local_12c0);
    testing::internal::AssertHelper::~AssertHelper(&local_12c8);
    std::__cxx11::string::~string((string *)&minusABCD.data_);
    testing::Message::~Message(&local_12c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12b0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_55.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::operator-
            ((dense *)&local_1318,(SquareMatrix<float> *)&gtest_ar_55.message_,
             (SquareMatrix<float> *)&C.data_);
  qclab::dense::operator-((dense *)&local_1308,&local_1318,(SquareMatrix<float> *)&D.data_);
  qclab::dense::operator-((dense *)local_12f8,&local_1308,(SquareMatrix<float> *)&sumAB_check.data_)
  ;
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1308);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1318);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_55.message_);
  local_1340 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)local_12f8);
  local_1344 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1338,"minusABCD.size()","2",&local_1340,&local_1344);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1338);
  if (!bVar1) {
    testing::Message::Message(&local_1350);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__25.message_,&local_1350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_1350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1338);
  local_1369 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)local_12f8,(SquareMatrix<float> *)&minusAB.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1368,&local_1369,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1368);
  if (!bVar1) {
    testing::Message::Message(&local_1378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minus.data_,(internal *)local_1368,
               (AssertionResult *)"minusABCD == minusABCD_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1380,&local_1378);
    testing::internal::AssertHelper::~AssertHelper(&local_1380);
    std::__cxx11::string::~string((string *)&minus.data_);
    testing::Message::~Message(&local_1378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1368);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__26.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::SquareMatrix<float>::operator-=
            ((SquareMatrix<float> *)&gtest_ar__26.message_,(SquareMatrix<float> *)&C.data_);
  local_13c1 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__26.message_,
                          (SquareMatrix<float> *)&minusABC_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_13c0,&local_13c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13c0);
  if (!bVar1) {
    testing::Message::Message(&local_13d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_13c0,
               (AssertionResult *)"minus == minusAB_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_13d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_13d8,&local_13d0);
    testing::internal::AssertHelper::~AssertHelper(&local_13d8);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_13d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13c0);
  qclab::dense::SquareMatrix<float>::operator-=
            ((SquareMatrix<float> *)&gtest_ar__26.message_,(SquareMatrix<float> *)&D.data_);
  local_1409 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__26.message_,
                          (SquareMatrix<float> *)&minusABCD_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1408,&local_1409,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1408);
  if (!bVar1) {
    testing::Message::Message(&local_1418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_1408,
               (AssertionResult *)"minus == minusABC_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1420,&local_1418);
    testing::internal::AssertHelper::~AssertHelper(&local_1420);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_1418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1408);
  qclab::dense::SquareMatrix<float>::operator-=
            ((SquareMatrix<float> *)&gtest_ar__26.message_,(SquareMatrix<float> *)&sumAB_check.data_
            );
  local_1451 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__26.message_,
                          (SquareMatrix<float> *)&minusAB.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1450,&local_1451,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1450);
  if (!bVar1) {
    testing::Message::Message(&local_1460);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prodAB_check.data_,(internal *)local_1450,
               (AssertionResult *)"minus == minusABCD_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1468,&local_1460);
    testing::internal::AssertHelper::~AssertHelper(&local_1468);
    std::__cxx11::string::~string((string *)&prodAB_check.data_);
    testing::Message::~Message(&local_1460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1450);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&prodABC_check.data_,17.0,23.0,39.0,53.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&prodABCD_check.data_,383.0,463.0,881.0,1065.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&prodAB.data_,11924.0,12770.0,27428.0,29374.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_56.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::operator*
            ((dense *)local_14c8,(SquareMatrix<float> *)&gtest_ar_56.message_,
             (SquareMatrix<float> *)&C.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_56.message_);
  local_14f0 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)local_14c8);
  local_14f4 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_14e8,"prodAB.size()","2",&local_14f0,&local_14f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14e8);
  if (!bVar1) {
    testing::Message::Message(&local_1500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_14e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__29.message_,&local_1500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_1500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14e8);
  local_1519 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)local_14c8,
                          (SquareMatrix<float> *)&prodABC_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1518,&local_1519,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1518);
  if (!bVar1) {
    testing::Message::Message(&local_1528);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prodABC.data_,(internal *)local_1518,
               (AssertionResult *)"prodAB == prodAB_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1530,&local_1528);
    testing::internal::AssertHelper::~AssertHelper(&local_1530);
    std::__cxx11::string::~string((string *)&prodABC.data_);
    testing::Message::~Message(&local_1528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1518);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_57.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::operator*
            ((dense *)&local_1570,(SquareMatrix<float> *)&gtest_ar_57.message_,
             (SquareMatrix<float> *)&C.data_);
  qclab::dense::operator*((dense *)local_1560,&local_1570,(SquareMatrix<float> *)&D.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1570);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_57.message_);
  local_1598 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)local_1560);
  local_159c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1590,"prodABC.size()","2",&local_1598,&local_159c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1590);
  if (!bVar1) {
    testing::Message::Message(&local_15a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1590);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__30.message_,&local_15a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_15a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1590);
  local_15c1 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)local_1560,
                          (SquareMatrix<float> *)&prodABCD_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_15c0,&local_15c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c0);
  if (!bVar1) {
    testing::Message::Message(&local_15d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prodABCD.data_,(internal *)local_15c0,
               (AssertionResult *)"prodABC == prodABC_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_15d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_15d8,&local_15d0);
    testing::internal::AssertHelper::~AssertHelper(&local_15d8);
    std::__cxx11::string::~string((string *)&prodABCD.data_);
    testing::Message::~Message(&local_15d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_58.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::operator*
            ((dense *)&local_1628,(SquareMatrix<float> *)&gtest_ar_58.message_,
             (SquareMatrix<float> *)&C.data_);
  qclab::dense::operator*((dense *)&local_1618,&local_1628,(SquareMatrix<float> *)&D.data_);
  qclab::dense::operator*((dense *)local_1608,&local_1618,(SquareMatrix<float> *)&sumAB_check.data_)
  ;
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1618);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1628);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_58.message_);
  local_1650 = qclab::dense::SquareMatrix<float>::size((SquareMatrix<float> *)local_1608);
  local_1654 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1648,"prodABCD.size()","2",&local_1650,&local_1654);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1648);
  if (!bVar1) {
    testing::Message::Message(&local_1660);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1648);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__31.message_,&local_1660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_1660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1648);
  local_1679 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)local_1608,(SquareMatrix<float> *)&prodAB.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1678,&local_1679,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1678);
  if (!bVar1) {
    testing::Message::Message(&local_1688);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prod.data_,(internal *)local_1678,
               (AssertionResult *)"prodABCD == prodABCD_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1690,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1690,&local_1688);
    testing::internal::AssertHelper::~AssertHelper(&local_1690);
    std::__cxx11::string::~string((string *)&prod.data_);
    testing::Message::~Message(&local_1688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1678);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__32.message_,(SquareMatrix<float> *)&B.data_);
  qclab::dense::SquareMatrix<float>::operator*=
            ((SquareMatrix<float> *)&gtest_ar__32.message_,(SquareMatrix<float> *)&C.data_);
  local_16d1 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__32.message_,
                          (SquareMatrix<float> *)&prodABC_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_16d0,&local_16d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16d0);
  if (!bVar1) {
    testing::Message::Message(&local_16e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__33.message_,(internal *)local_16d0,
               (AssertionResult *)"prod == prodAB_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,200,pcVar2);
    testing::internal::AssertHelper::operator=(&local_16e8,&local_16e0);
    testing::internal::AssertHelper::~AssertHelper(&local_16e8);
    std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
    testing::Message::~Message(&local_16e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16d0);
  qclab::dense::SquareMatrix<float>::operator*=
            ((SquareMatrix<float> *)&gtest_ar__32.message_,(SquareMatrix<float> *)&D.data_);
  local_1719 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__32.message_,
                          (SquareMatrix<float> *)&prodABCD_check.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1718,&local_1719,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1718);
  if (!bVar1) {
    testing::Message::Message(&local_1728);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__34.message_,(internal *)local_1718,
               (AssertionResult *)"prod == prodABC_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1730,&local_1728);
    testing::internal::AssertHelper::~AssertHelper(&local_1730);
    std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
    testing::Message::~Message(&local_1728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1718);
  qclab::dense::SquareMatrix<float>::operator*=
            ((SquareMatrix<float> *)&gtest_ar__32.message_,(SquareMatrix<float> *)&sumAB_check.data_
            );
  local_1761 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__32.message_,
                          (SquareMatrix<float> *)&prodAB.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1760,&local_1761,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1760);
  if (!bVar1) {
    testing::Message::Message(&local_1770);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Z.data_,(internal *)local_1760,(AssertionResult *)"prod == prodABCD_check"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xca,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1778,&local_1770);
    testing::internal::AssertHelper::~AssertHelper(&local_1778);
    std::__cxx11::string::~string((string *)&Z.data_);
    testing::Message::~Message(&local_1770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1760);
  qclab::dense::zeros<float>((dense *)&Z_check.data_,2);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__35.message_,0.0,0.0,0.0,0.0);
  local_17c9 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&Z_check.data_,
                          (SquareMatrix<float> *)&gtest_ar__35.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_17c8,&local_17c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17c8);
  if (!bVar1) {
    testing::Message::Message(&local_17d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&I.data_,(internal *)local_17c8,(AssertionResult *)"Z == Z_check","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xd0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_17e0,&local_17d8);
    testing::internal::AssertHelper::~AssertHelper(&local_17e0);
    std::__cxx11::string::~string((string *)&I.data_);
    testing::Message::~Message(&local_17d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17c8);
  qclab::dense::eye<float>((dense *)&I_check.data_,2);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__36.message_,1.0,0.0,0.0,1.0);
  local_1831 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&I_check.data_,
                          (SquareMatrix<float> *)&gtest_ar__36.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1830,&local_1831,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1830);
  if (!bVar1) {
    testing::Message::Message(&local_1840);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1868,(internal *)local_1830,(AssertionResult *)"I == I_check","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1848,&local_1840);
    testing::internal::AssertHelper::~AssertHelper(&local_1848);
    std::__cxx11::string::~string((string *)&local_1868);
    testing::Message::~Message(&local_1840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1830);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__36.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&I_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__35.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&Z_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__32.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_1608);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_1560);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_14c8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&prodAB.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&prodABCD_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&prodABC_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__26.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_12f8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_1250);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_11b8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&minusAB.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&minusABCD_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&minusABC_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__20.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_fe8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_f40);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_ea8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&sumAB.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&sumABCD_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&sumABC_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&sumAB_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&D.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&C.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&B.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__13.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_46.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_42.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_38.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_18.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_10.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_5.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar.message_);
  return;
}

Assistant:

void test_qclab_dense_SquareMatrix() {

  qclab::dense::SquareMatrix< T >  M1( 3 ) ;
  EXPECT_EQ( M1.size() , 3 ) ;
  EXPECT_EQ( M1.rows() , 3 ) ;
  EXPECT_EQ( M1.cols() , 3 ) ;
  EXPECT_EQ( M1.ld() , 3 ) ;

  int c = 0 ;
  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      M1(i,j) = c + 0.5 ;
      c++ ;
    }
  }
  c = 0 ;
  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      EXPECT_EQ( M1(i,j) , T(c + 0.5) ) ;
      c++ ;
    }
  }

  qclab::dense::SquareMatrix< T >  M2( 3 , 3.14 ) ;
  EXPECT_EQ( M2.size() , 3 ) ;
  EXPECT_EQ( M2.rows() , 3 ) ;
  EXPECT_EQ( M2.cols() , 3 ) ;
  EXPECT_EQ( M2.ld() , 3 ) ;

  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      EXPECT_EQ( M2(i,j) , T(3.14) ) ;
    }
  }

  qclab::dense::SquareMatrix< T >  M3( 1.0 , 2.0 ,
                                       3.0 , 4.0 ) ;
  EXPECT_EQ( M3.size() , 2 ) ;
  EXPECT_EQ( M3.rows() , 2 ) ;
  EXPECT_EQ( M3.cols() , 2 ) ;
  EXPECT_EQ( M3.ld() , 2 ) ;

  EXPECT_EQ( M3(0,0) , T(1.0) ) ;
  EXPECT_EQ( M3(1,0) , T(3.0) ) ;
  EXPECT_EQ( M3(0,1) , T(2.0) ) ;
  EXPECT_EQ( M3(1,1) , T(4.0) ) ;

  qclab::dense::SquareMatrix< T >  M4(  1.0 ,  2.0 ,  3.0 ,  4.0 ,
                                        5.0 ,  6.0 ,  7.0 ,  8.0 ,
                                        9.0 , 10.0 , 11.0 , 12.0 ,
                                       13.0 , 14.0 , 15.0 , 16.0 ) ;
  EXPECT_EQ( M4.size() , 4 ) ;
  EXPECT_EQ( M4.rows() , 4 ) ;
  EXPECT_EQ( M4.cols() , 4 ) ;
  EXPECT_EQ( M4.ld() , 4 ) ;

  // column 1
  EXPECT_EQ( M4(0,0) , T( 1.0) ) ;
  EXPECT_EQ( M4(1,0) , T( 5.0) ) ;
  EXPECT_EQ( M4(2,0) , T( 9.0) ) ;
  EXPECT_EQ( M4(3,0) , T(13.0) ) ;
  // column 2
  EXPECT_EQ( M4(0,1) , T( 2.0) ) ;
  EXPECT_EQ( M4(1,1) , T( 6.0) ) ;
  EXPECT_EQ( M4(2,1) , T(10.0) ) ;
  EXPECT_EQ( M4(3,1) , T(14.0) ) ;
  // column 3
  EXPECT_EQ( M4(0,2) , T( 3.0) ) ;
  EXPECT_EQ( M4(1,2) , T( 7.0) ) ;
  EXPECT_EQ( M4(2,2) , T(11.0) ) ;
  EXPECT_EQ( M4(3,2) , T(15.0) ) ;
  // column 4
  EXPECT_EQ( M4(0,3) , T( 4.0) ) ;
  EXPECT_EQ( M4(1,3) , T( 8.0) ) ;
  EXPECT_EQ( M4(2,3) , T(12.0) ) ;
  EXPECT_EQ( M4(3,3) , T(16.0) ) ;

  qclab::dense::SquareMatrix< T >  M4copy( M4 ) ;
  EXPECT_EQ( M4copy.size() , 4 ) ;
  EXPECT_EQ( M4copy.rows() , 4 ) ;
  EXPECT_EQ( M4copy.cols() , 4 ) ;
  EXPECT_EQ( M4copy.ld() , 4 ) ;
  EXPECT_TRUE( M4copy == M4 ) ;

  // operator =
  qclab::dense::SquareMatrix< T >  M1copy ;
  M1copy = M1 ;
  EXPECT_EQ( M1copy.size() , 3 ) ;
  EXPECT_EQ( M1copy.rows() , 3 ) ;
  EXPECT_EQ( M1copy.cols() , 3 ) ;
  EXPECT_EQ( M1copy.ld() , 3 ) ;
  EXPECT_TRUE( M1copy == M1 ) ;

  qclab::dense::SquareMatrix< T >  M2copy( 3 ) ;
  M2copy = M2 ;
  EXPECT_EQ( M2copy.size() , 3 ) ;
  EXPECT_EQ( M2copy.rows() , 3 ) ;
  EXPECT_EQ( M2copy.cols() , 3 ) ;
  EXPECT_EQ( M2copy.ld() , 3 ) ;
  EXPECT_TRUE( M2copy == M2 ) ;

  // operators == and !=
  EXPECT_TRUE( M2 == M2 ) ; EXPECT_FALSE( M2 != M2 ) ;
  EXPECT_TRUE( M3 == M3 ) ; EXPECT_FALSE( M3 != M3 ) ;
  EXPECT_TRUE( M4 == M4 ) ; EXPECT_FALSE( M4 != M4 ) ;
  EXPECT_TRUE( M2 != M3 ) ; EXPECT_FALSE( M2 == M3 ) ;
  EXPECT_TRUE( M3 != M4 ) ; EXPECT_FALSE( M3 == M4 ) ;

  qclab::dense::SquareMatrix< T >  M5(  1.0 ,  2.0 ,  3.0 ,  4.0 ,
                                        5.0 ,  6.0 ,  0.0 ,  8.0 ,
                                        9.0 , 10.0 , 11.0 , 12.0 ,
                                       13.0 , 14.0 , 15.0 , 16.0 ) ;
  EXPECT_TRUE( M4 != M5 ) ; EXPECT_FALSE( M4 == M5 ) ;
  M5(1,2) = 7.0 ;
  EXPECT_TRUE( M4 == M5 ) ; EXPECT_FALSE( M4 != M5 ) ;

  // operators +=, -=, *=, +, - and *
  qclab::dense::SquareMatrix< T >  A( 1 , 2 ,
                                      3 , 4 ) ;
  qclab::dense::SquareMatrix< T >  B( 5 , 7 ,
                                      6 , 8 ) ;
  qclab::dense::SquareMatrix< T >  C(  9 , 11 ,
                                      10 , 12 ) ;
  qclab::dense::SquareMatrix< T >  D( 13 , 14 ,
                                      15 , 16 ) ;

  qclab::dense::SquareMatrix< T >  sumAB_check(  6 ,  9 ,
                                                 9 , 12 ) ;
  qclab::dense::SquareMatrix< T >  sumABC_check( 15 , 20 ,
                                                 19 , 24 ) ;
  qclab::dense::SquareMatrix< T >  sumABCD_check( 28 , 34 ,
                                                  34 , 40 ) ;

  auto sumAB = A + B ;
  EXPECT_EQ( sumAB.size() , 2 ) ;
  EXPECT_TRUE( sumAB == sumAB_check ) ;

  auto sumABC = A + B + C ;
  EXPECT_EQ( sumABC.size() , 2 ) ;
  EXPECT_TRUE( sumABC == sumABC_check ) ;

  auto sumABCD = A + B + C + D ;
  EXPECT_EQ( sumABCD.size() , 2 ) ;
  EXPECT_TRUE( sumABCD == sumABCD_check ) ;

  auto sum = A ;
  sum += B ;  EXPECT_TRUE( sum == sumAB_check ) ;
  sum += C ;  EXPECT_TRUE( sum == sumABC_check ) ;
  sum += D ;  EXPECT_TRUE( sum == sumABCD_check ) ;

  qclab::dense::SquareMatrix< T >  minusAB_check( -4 , -5 ,
                                                  -3 , -4 ) ;
  qclab::dense::SquareMatrix< T >  minusABC_check( -13 , -16 ,
                                                   -13 , -16 ) ;
  qclab::dense::SquareMatrix< T >  minusABCD_check( -26 , -30 ,
                                                    -28 , -32 ) ;

  auto minusAB = A - B ;
  EXPECT_EQ( minusAB.size() , 2 ) ;
  EXPECT_TRUE( minusAB == minusAB_check ) ;

  auto minusABC = A - B - C ;
  EXPECT_EQ( minusABC.size() , 2 ) ;
  EXPECT_TRUE( minusABC == minusABC_check ) ;

  auto minusABCD = A - B - C - D ;
  EXPECT_EQ( minusABCD.size() , 2 ) ;
  EXPECT_TRUE( minusABCD == minusABCD_check ) ;

  auto minus = A ;
  minus -= B ;  EXPECT_TRUE( minus == minusAB_check ) ;
  minus -= C ;  EXPECT_TRUE( minus == minusABC_check ) ;
  minus -= D ;  EXPECT_TRUE( minus == minusABCD_check ) ;

  qclab::dense::SquareMatrix< T >  prodAB_check( 17 , 23 ,
                                                 39 , 53 ) ;
  qclab::dense::SquareMatrix< T >  prodABC_check( 383 ,  463 ,
                                                  881 , 1065 ) ;
  qclab::dense::SquareMatrix< T >  prodABCD_check( 11924 , 12770 ,
                                                   27428 , 29374 ) ;

  auto prodAB = A * B ;
  EXPECT_EQ( prodAB.size() , 2 ) ;
  EXPECT_TRUE( prodAB == prodAB_check ) ;

  auto prodABC = A * B * C ;
  EXPECT_EQ( prodABC.size() , 2 ) ;
  EXPECT_TRUE( prodABC == prodABC_check ) ;

  auto prodABCD = A * B * C * D ;
  EXPECT_EQ( prodABCD.size() , 2 ) ;
  EXPECT_TRUE( prodABCD == prodABCD_check ) ;

  auto prod = A ;
  prod *= B ;  EXPECT_TRUE( prod == prodAB_check ) ;
  prod *= C ;  EXPECT_TRUE( prod == prodABC_check ) ;
  prod *= D ;  EXPECT_TRUE( prod == prodABCD_check ) ;

  // zeros
  auto Z = qclab::dense::zeros< T >( 2 ) ;
  qclab::dense::SquareMatrix< T >  Z_check( 0 , 0 ,
                                            0 , 0 ) ;
  EXPECT_TRUE( Z == Z_check ) ;

  // eye
  auto I = qclab::dense::eye< T >( 2 ) ;
  qclab::dense::SquareMatrix< T >  I_check( 1 , 0 ,
                                            0 , 1 ) ;
  EXPECT_TRUE( I == I_check ) ;

}